

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O0

void es5503_write_ram(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  ES5503Chip *chip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset < *(uint *)((long)info + 8)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 8) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 8) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 0x10) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void es5503_write_ram(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	ES5503Chip *chip = (ES5503Chip *)info;
	
	if (offset >= chip->dramsize)
		return;
	if (offset + length > chip->dramsize)
		length = chip->dramsize - offset;
	
	memcpy(chip->docram + offset, data, length);
	
	return;
}